

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O3

void __thiscall
OpenMD::StringTokenizer::StringTokenizer
          (StringTokenizer *this,const_iterator *first,const_iterator *last,string *delim)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  
  pcVar1 = first->_M_current;
  pcVar2 = last->_M_current;
  (this->tokenString_)._M_dataplus._M_p = (pointer)&(this->tokenString_).field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)this,pcVar1,pcVar2);
  (this->delim_)._M_dataplus._M_p = (pointer)&(this->delim_).field_2;
  pcVar3 = (delim->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->delim_,pcVar3,pcVar3 + delim->_M_string_length);
  this->returnTokens_ = false;
  pcVar3 = (this->tokenString_)._M_dataplus._M_p;
  (this->currentPos_)._M_current = pcVar3;
  (this->end_)._M_current = pcVar3 + (this->tokenString_)._M_string_length;
  return;
}

Assistant:

StringTokenizer::StringTokenizer(std::string::const_iterator& first,
                                   std::string::const_iterator& last,
                                   const std::string& delim) :
      tokenString_(first, last),
      delim_(delim), returnTokens_(false), currentPos_(tokenString_.begin()),
      end_(tokenString_.end()) {}